

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblyModule::AllocateFunctionExports(WebAssemblyModule *this,uint32 entries)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  WasmExport *ptr;
  TrackAllocData local_40;
  uint32 local_14;
  WebAssemblyModule *pWStack_10;
  uint32 entries_local;
  WebAssemblyModule *this_local;
  
  pAVar1 = &this->m_alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  local_14 = entries;
  pWStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&Wasm::WasmExport::typeinfo,0,(ulong)entries,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
             ,0x237);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_40);
  ptr = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::WasmExport,false>
                  ((Memory *)pAVar1,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                   (ulong)local_14);
  Memory::WriteBarrierPtr<Wasm::WasmExport>::operator=(&this->m_exports,ptr);
  this->m_exportCount = local_14;
  return;
}

Assistant:

void
WebAssemblyModule::AllocateFunctionExports(uint32 entries)
{
    m_exports = AnewArrayZ(m_alloc, Wasm::WasmExport, entries);
    m_exportCount = entries;
}